

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

void __thiscall
Rml::ElementDocument::OnPropertyChange(ElementDocument *this,PropertyIdSet *changed_properties)

{
  bool bVar1;
  ElementStyle *this_00;
  
  Element::OnPropertyChange(&this->super_Element,changed_properties);
  bVar1 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x32);
  if (bVar1) {
    this_00 = Element::GetStyle(&this->super_Element);
    ElementStyle::DirtyPropertiesWithUnitsRecursive(this_00,REM);
  }
  bVar1 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x17);
  if ((((!bVar1) &&
       (bVar1 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x18), !bVar1)) &&
      (bVar1 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x19), !bVar1)) &&
     (bVar1 = ::std::bitset<128UL>::test(&changed_properties->defined_ids,0x1a), !bVar1)) {
    return;
  }
  this->position_dirty = true;
  return;
}

Assistant:

void ElementDocument::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	Element::OnPropertyChange(changed_properties);

	// If the document's font-size has been changed, we need to dirty all rem properties.
	if (changed_properties.Contains(PropertyId::FontSize))
		GetStyle()->DirtyPropertiesWithUnitsRecursive(Unit::REM);

	if (changed_properties.Contains(PropertyId::Top) ||    //
		changed_properties.Contains(PropertyId::Right) ||  //
		changed_properties.Contains(PropertyId::Bottom) || //
		changed_properties.Contains(PropertyId::Left))
		DirtyPosition();
}